

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha2.c
# Opt level: O0

int SHA384_Final(uchar *md,SHA512_CTX *c)

{
  ulong uVar1;
  void *pvVar2;
  sha2_word64 tmp;
  ulonglong *puStack_20;
  int j;
  sha2_word64 *d;
  SHA384_CTX *context_local;
  sha2_byte *digest_local;
  
  if (c == (SHA512_CTX *)0x0) {
    __assert_fail("context != (SHA384_CTX*)0",
                  "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sha2.c",
                  0x3e6,"void SHA384_Final(sha2_byte *, SHA384_CTX *)");
  }
  if (md != (uchar *)0x0) {
    SHA512_Last((SHA512_CTX *)c);
    puStack_20 = (ulonglong *)md;
    for (tmp._4_4_ = 0; tmp._4_4_ < 6; tmp._4_4_ = tmp._4_4_ + 1) {
      uVar1 = c->h[tmp._4_4_] >> 0x20 | c->h[tmp._4_4_] << 0x20;
      uVar1 = (uVar1 & 0xff00ff00ff00ff00) >> 8 | (uVar1 & 0xff00ff00ff00ff) << 8;
      c->h[tmp._4_4_] = (uVar1 & 0xffff0000ffff0000) >> 0x10 | (uVar1 & 0xffff0000ffff) << 0x10;
      *puStack_20 = c->h[tmp._4_4_];
      puStack_20 = puStack_20 + 1;
    }
  }
  pvVar2 = memset(c,0,0xd0);
  return (int)pvVar2;
}

Assistant:

void SHA384_Final(sha2_byte digest[SHA384_DIGEST_LENGTH], SHA384_CTX* context) {
	sha2_word64	*d = (sha2_word64*)digest;

	/* Sanity check: */
	assert(context != (SHA384_CTX*)0);

	/* If no digest buffer is passed, we don't bother doing this: */
	if (digest != (sha2_byte*)0) {
		SHA512_Last((SHA512_CTX*)context);

		/* Save the hash data for output: */
#if BYTE_ORDER == LITTLE_ENDIAN
		{
			/* Convert TO host byte order */
			int	j;
			for (j = 0; j < 6; j++) {
				REVERSE64(context->state[j],context->state[j]);
				*d++ = context->state[j];
			}
		}
#else
		MEMCPY_BCOPY(d, context->state, SHA384_DIGEST_LENGTH);
#endif
	}

	/* Zero out state data */
	MEMSET_BZERO(context, sizeof(SHA384_CTX));
}